

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

double logsum2(double a,double b)

{
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double local_8;
  
  if (((in_XMM0_Qa != 1000.0) || (local_8 = in_XMM1_Qa, NAN(in_XMM0_Qa))) &&
     ((in_XMM1_Qa != 1000.0 || (local_8 = in_XMM0_Qa, NAN(in_XMM1_Qa))))) {
    if (in_XMM0_Qa <= in_XMM1_Qa) {
      dVar1 = exp(in_XMM0_Qa - in_XMM1_Qa);
      local_8 = log(dVar1 + 1.0);
      local_8 = in_XMM1_Qa + local_8;
    }
    else {
      dVar1 = exp(in_XMM1_Qa - in_XMM0_Qa);
      local_8 = log(dVar1 + 1.0);
      local_8 = in_XMM0_Qa + local_8;
    }
  }
  return local_8;
}

Assistant:

double logsum2(double a, double b)
{
    if(a==1000)
        return b;
    else if(b==1000)
        return a;
    else if(a>b)
        return a + log(1 + exp(b-a));
    else
        return b + log(1 + exp(a-b));
}